

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

bool depspawn::internal::is_contained(Workitem *w,Workitem *ancestor)

{
  arg_info *this;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  arg_info **ppaVar4;
  arg_info *other;
  
  ppaVar4 = &w->args;
  other = ancestor->args;
LAB_00111bb7:
  this = *ppaVar4;
  do {
    if ((other == (arg_info *)0x0) || (this == (arg_info *)0x0)) {
      return this == (arg_info *)0x0;
    }
    uVar1 = this->addr;
    uVar2 = other->addr;
    if (uVar1 < uVar2) {
      return false;
    }
    if (this->rank == '\0') {
      if (uVar1 + this->size <= uVar2 + other->size) goto LAB_00111bfe;
    }
    else if (uVar2 == uVar1) break;
    other = other->next;
  } while( true );
  bVar3 = arg_info::is_contained_array(this,other);
  if (!bVar3) {
    return false;
  }
LAB_00111bfe:
  ppaVar4 = &this->next;
  goto LAB_00111bb7;
}

Assistant:

bool is_contained(const Workitem* const w, const Workitem * const ancestor)
    {
      const arg_info *arg_w = w->args;
      const arg_info *arg_p = ancestor->args;
      
      while(arg_p && arg_w) {
        
        if (arg_w->addr < arg_p->addr) {
          return false;
        }
        
        if (arg_w->is_array()) {
          if(arg_p->addr == arg_w->addr) {
            if(!arg_w->is_contained_array(arg_p))
              return false;
            //Same array. Was contained => progress w
            arg_w = arg_w->next;
          } else { // Different array, arg_w->addr > arg_p->addr => progress p
            arg_p = arg_p->next;
          }
        } else { //Here arg_p->addr <= arg_w->addr
          if ((arg_w->addr + arg_w->size) <= (arg_p->addr + arg_p->size) ) {
            arg_w = arg_w->next;
          } else {
            arg_p = arg_p->next;
          }
        }
        
      }
      
      return arg_w == nullptr;
    }